

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O1

int pcap_inject_linux(pcap_t *handle,void *buf,size_t size)

{
  void *pvVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  
  pvVar1 = handle->priv;
  if (*(int *)((long)pvVar1 + 0x38) == 0) {
    if (*(int *)((long)pvVar1 + 0x40) == -1) {
      pcVar4 = "Sending packets isn\'t supported on the \"any\" device";
    }
    else {
      if (*(int *)((long)pvVar1 + 0x3c) == 0) goto LAB_0011a927;
      pcVar4 = "Sending packets isn\'t supported in cooked mode";
    }
    strncpy(handle->errbuf,pcVar4,0x100);
    handle->errbuf[0xff] = '\0';
  }
  else {
LAB_0011a927:
    sVar2 = send(handle->fd,buf,size,0);
    if ((int)sVar2 != -1) {
      return (int)sVar2;
    }
    piVar3 = __errno_location();
    pcVar4 = pcap_strerror(*piVar3);
    snprintf(handle->errbuf,0x100,"send: %s",pcVar4);
  }
  return -1;
}

Assistant:

static int
pcap_inject_linux(pcap_t *handle, const void *buf, size_t size)
{
	struct pcap_linux *handlep = handle->priv;
	int ret;

#ifdef HAVE_PF_PACKET_SOCKETS
	if (!handlep->sock_packet) {
		/* PF_PACKET socket */
		if (handlep->ifindex == -1) {
			/*
			 * We don't support sending on the "any" device.
			 */
			strlcpy(handle->errbuf,
			    "Sending packets isn't supported on the \"any\" device",
			    PCAP_ERRBUF_SIZE);
			return (-1);
		}

		if (handlep->cooked) {
			/*
			 * We don't support sending on the "any" device.
			 *
			 * XXX - how do you send on a bound cooked-mode
			 * socket?
			 * Is a "sendto()" required there?
			 */
			strlcpy(handle->errbuf,
			    "Sending packets isn't supported in cooked mode",
			    PCAP_ERRBUF_SIZE);
			return (-1);
		}
	}
#endif

	ret = send(handle->fd, buf, size, 0);
	if (ret == -1) {
		pcap_snprintf(handle->errbuf, PCAP_ERRBUF_SIZE, "send: %s",
		    pcap_strerror(errno));
		return (-1);
	}
	return (ret);
}